

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::deserialize_w_v_b(Model *this,FILE *file)

{
  int iVar1;
  char *in_RDI;
  bool in_stack_0000015f;
  Model *in_stack_00000160;
  size_t in_stack_00000268;
  char *in_stack_00000270;
  FILE *in_stack_00000278;
  
  ReadDataFromDisk(in_stack_00000278,in_stack_00000270,in_stack_00000268);
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 != 0) {
    ReadDataFromDisk(in_stack_00000278,in_stack_00000270,in_stack_00000268);
  }
  initial(in_stack_00000160,in_stack_0000015f);
  ReadDataFromDisk(in_stack_00000278,in_stack_00000270,in_stack_00000268);
  ReadDataFromDisk(in_stack_00000278,in_stack_00000270,in_stack_00000268);
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 != 0) {
    ReadDataFromDisk(in_stack_00000278,in_stack_00000270,in_stack_00000268);
  }
  return;
}

Assistant:

void Model::deserialize_w_v_b(FILE* file) {
  // Read size of w
  ReadDataFromDisk(file, (char*)&param_num_w_, sizeof(param_num_w_));
  // Read size of v
  if (score_func_.compare("linear") != 0) {
    ReadDataFromDisk(file, (char*)&param_num_v_, sizeof(param_num_v_));
  }
  // Allocate memory. Don't set value here
  this->initial(false);
  // Read w
  ReadDataFromDisk(file, (char*)param_w_, sizeof(real_t)*param_num_w_);
  // Read b
  ReadDataFromDisk(file, (char*)param_b_, sizeof(real_t)*aux_size_);
  // Read v
  if (score_func_.compare("linear") != 0) {
    ReadDataFromDisk(file, (char*)param_v_, sizeof(real_t)*param_num_v_);
  }
}